

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i x_convolve_6tap_4x2_ssse3(uint8_t *src,ptrdiff_t stride,__m128i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i *in_RDX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  __m128i alVar4;
  __m128i ss [3];
  __m128i sfl2;
  __m128i sfl1;
  __m128i sfl0;
  __m128i s;
  ptrdiff_t in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe42;
  undefined1 in_stack_fffffffffffffe43;
  undefined1 in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe45;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  __m128i local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  __m128i *local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98 [16];
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_78 [16];
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58 [16];
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_140 = in_RDX;
  load_u8_8x2_sse2((uint8_t *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,
                                     CONCAT15(in_stack_fffffffffffffe45,
                                              CONCAT14(in_stack_fffffffffffffe44,
                                                       CONCAT13(in_stack_fffffffffffffe43,
                                                                CONCAT12(in_stack_fffffffffffffe42,
                                                                         in_stack_fffffffffffffe40))
                                                      )))),in_stack_fffffffffffffe38);
  local_99 = 0;
  local_9a = 1;
  local_9b = 1;
  local_9c = 2;
  local_9d = 8;
  local_9e = 9;
  local_9f = 9;
  local_a0 = 10;
  local_a1 = 0;
  local_a2 = 0;
  local_a3 = 0;
  local_a4 = 0;
  local_a5 = 0;
  local_a6 = 0;
  local_a7 = 0;
  local_a8 = 0;
  local_79 = 0;
  local_7a = 0;
  local_7b = 0;
  local_7c = 0;
  local_7d = 0;
  local_7e = 0;
  local_7f = 0;
  local_80 = 0;
  local_81 = 10;
  local_82 = 9;
  local_83 = 9;
  local_84 = 8;
  local_85 = 2;
  local_86 = 1;
  local_87 = 1;
  local_88 = 0;
  auVar1 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,2,3);
  auVar1 = vpinsrb_avx(auVar1,8,4);
  auVar1 = vpinsrb_avx(auVar1,9,5);
  auVar1 = vpinsrb_avx(auVar1,9,6);
  auVar1 = vpinsrb_avx(auVar1,10,7);
  auVar1 = vpinsrb_avx(auVar1,0,8);
  auVar1 = vpinsrb_avx(auVar1,0,9);
  auVar1 = vpinsrb_avx(auVar1,0,10);
  auVar1 = vpinsrb_avx(auVar1,0,0xb);
  auVar1 = vpinsrb_avx(auVar1,0,0xc);
  auVar1 = vpinsrb_avx(auVar1,0,0xd);
  auVar1 = vpinsrb_avx(auVar1,0,0xe);
  local_98 = vpinsrb_avx(auVar1,0,0xf);
  local_168 = local_98._0_8_;
  uStack_160 = local_98._8_8_;
  local_a9 = 2;
  local_aa = 3;
  local_ab = 3;
  local_ac = 4;
  local_ad = 10;
  local_ae = 0xb;
  local_af = 0xb;
  local_b0 = 0xc;
  local_b1 = 0;
  local_b2 = 0;
  local_b3 = 0;
  local_b4 = 0;
  local_b5 = 0;
  local_b6 = 0;
  local_b7 = 0;
  local_b8 = 0;
  local_59 = 0;
  local_5a = 0;
  local_5b = 0;
  local_5c = 0;
  local_5d = 0;
  local_5e = 0;
  local_5f = 0;
  local_60 = 0;
  local_61 = 0xc;
  local_62 = 0xb;
  local_63 = 0xb;
  local_64 = 10;
  local_65 = 4;
  local_66 = 3;
  local_67 = 3;
  local_68 = 2;
  auVar1 = vpinsrb_avx(ZEXT116(2),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,4,3);
  auVar1 = vpinsrb_avx(auVar1,10,4);
  auVar1 = vpinsrb_avx(auVar1,0xb,5);
  auVar1 = vpinsrb_avx(auVar1,0xb,6);
  auVar1 = vpinsrb_avx(auVar1,0xc,7);
  auVar1 = vpinsrb_avx(auVar1,0,8);
  auVar1 = vpinsrb_avx(auVar1,0,9);
  auVar1 = vpinsrb_avx(auVar1,0,10);
  auVar1 = vpinsrb_avx(auVar1,0,0xb);
  auVar1 = vpinsrb_avx(auVar1,0,0xc);
  auVar1 = vpinsrb_avx(auVar1,0,0xd);
  auVar1 = vpinsrb_avx(auVar1,0,0xe);
  local_78 = vpinsrb_avx(auVar1,0,0xf);
  local_178 = local_78._0_8_;
  uStack_170 = local_78._8_8_;
  local_b9 = 4;
  local_ba = 5;
  local_bb = 5;
  local_bc = 6;
  local_bd = 0xc;
  local_be = 0xd;
  local_bf = 0xd;
  local_c0 = 0xe;
  local_c1 = 0;
  local_c2 = 0;
  local_c3 = 0;
  local_c4 = 0;
  local_c5 = 0;
  local_c6 = 0;
  local_c7 = 0;
  local_c8 = 0;
  local_31 = 0;
  local_32 = 0;
  local_33 = 0;
  local_34 = 0;
  local_35 = 0;
  local_36 = 0;
  local_37 = 0;
  local_38 = 0;
  local_39 = 0xe;
  local_3a = 0xd;
  local_3b = 0xd;
  local_3c = 0xc;
  local_3d = 6;
  local_3e = 5;
  local_3f = 5;
  local_40 = 4;
  auVar1 = vpinsrb_avx(ZEXT116(4),5,1);
  auVar1 = vpinsrb_avx(auVar1,5,2);
  auVar1 = vpinsrb_avx(auVar1,6,3);
  auVar1 = vpinsrb_avx(auVar1,0xc,4);
  auVar1 = vpinsrb_avx(auVar1,0xd,5);
  auVar1 = vpinsrb_avx(auVar1,0xd,6);
  auVar1 = vpinsrb_avx(auVar1,0xe,7);
  auVar1 = vpinsrb_avx(auVar1,0,8);
  auVar1 = vpinsrb_avx(auVar1,0,9);
  auVar1 = vpinsrb_avx(auVar1,0,10);
  auVar1 = vpinsrb_avx(auVar1,0,0xb);
  auVar1 = vpinsrb_avx(auVar1,0,0xc);
  auVar1 = vpinsrb_avx(auVar1,0,0xd);
  auVar1 = vpinsrb_avx(auVar1,0,0xe);
  local_58 = vpinsrb_avx(auVar1,0,0xf);
  local_188 = local_58._0_8_;
  uStack_180 = local_58._8_8_;
  local_e8 = local_98._0_8_;
  uStack_e0 = local_98._8_8_;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  local_1b8 = (__m128i)vpshufb_avx(auVar3,local_98);
  local_108 = local_78._0_8_;
  uStack_100 = local_78._8_8_;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  local_1a8 = vpshufb_avx(auVar2,local_78);
  local_128 = local_58._0_8_;
  uStack_120 = local_58._8_8_;
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  local_198 = vpshufb_avx(auVar1,local_58);
  alVar4 = convolve_6tap_ssse3(&local_1b8,local_140);
  alVar4[0] = alVar4[0];
  alVar4[1] = alVar4[1];
  return alVar4;
}

Assistant:

static inline __m128i x_convolve_6tap_4x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[3]) {
  const __m128i s = load_u8_8x2_sse2(src, stride);
  const __m128i sfl0 =
      _mm_setr_epi8(0, 1, 1, 2, 8, 9, 9, 10, 0, 0, 0, 0, 0, 0, 0, 0);
  const __m128i sfl1 =
      _mm_setr_epi8(2, 3, 3, 4, 10, 11, 11, 12, 0, 0, 0, 0, 0, 0, 0, 0);
  const __m128i sfl2 =
      _mm_setr_epi8(4, 5, 5, 6, 12, 13, 13, 14, 0, 0, 0, 0, 0, 0, 0, 0);
  __m128i ss[3];

  ss[0] = _mm_shuffle_epi8(s, sfl0);
  ss[1] = _mm_shuffle_epi8(s, sfl1);
  ss[2] = _mm_shuffle_epi8(s, sfl2);
  return convolve_6tap_ssse3(ss, coeffs);
}